

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O3

void match(lzma_coder_conflict9 *coder,uint32_t pos_state,uint32_t distance,uint32_t len)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  anon_enum_32 aVar5;
  long lVar6;
  anon_enum_32 aVar7;
  ulong uVar8;
  uint32_t model_index_1;
  uint uVar9;
  size_t sVar10;
  uint uVar11;
  bool bVar12;
  
  coder->state = (uint)(STATE_SHORTREP_LIT < coder->state) * 3 + STATE_LIT_MATCH;
  length(&coder->rc,&coder->match_len_encoder,pos_state,len,coder->fast_mode);
  if (distance < 0x2000) {
    uVar11 = (uint)""[distance];
  }
  else if (distance < 0x2000000) {
    uVar11 = ""[distance >> 0xc] + 0x18;
  }
  else {
    uVar11 = ""[distance >> 0x18] + 0x30;
  }
  uVar3 = 3;
  if (len < 6) {
    uVar3 = (ulong)(len - 2);
  }
  sVar1 = (coder->rc).count;
  uVar8 = 1;
  uVar9 = 5;
  lVar6 = 0;
  do {
    bVar12 = (uVar11 >> (uVar9 & 0x1f) & 1) != 0;
    (coder->rc).symbols[sVar1 + lVar6] = (uint)bVar12;
    (coder->rc).probs[sVar1 + lVar6] = coder->pos_slot[uVar3] + uVar8;
    uVar8 = (ulong)((uint)bVar12 + (int)uVar8 * 2);
    lVar6 = lVar6 + 1;
    uVar9 = uVar9 - 1;
  } while ((int)lVar6 != 6);
  sVar10 = sVar1 + lVar6;
  (coder->rc).count = sVar10;
  if (3 < uVar11) {
    iVar2 = (uVar11 >> 1) - 1;
    uVar9 = (uVar11 & 1 | 2) << ((byte)iVar2 & 0x1f);
    aVar7 = distance - uVar9;
    if (uVar11 < 0xe) {
      uVar4 = 1;
      do {
        aVar5 = aVar7 & RC_BIT_1;
        aVar7 = aVar7 >> 1;
        (coder->rc).symbols[sVar10] = aVar5;
        (coder->rc).probs[sVar10] =
             (probability *)
             ((long)coder + (ulong)uVar4 * 2 + ((ulong)uVar9 * 2 - (ulong)(uVar11 * 2)) + 0x70fa);
        sVar10 = sVar10 + 1;
        uVar4 = aVar5 + uVar4 * 2;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      (coder->rc).count = sVar10;
    }
    else {
      uVar11 = (uVar11 >> 1) - 6;
      do {
        (coder->rc).symbols[sVar1 + lVar6] =
             (((aVar7 >> 4) >> (uVar11 & 0x1f) & 1) != 0) + RC_DIRECT_0;
        lVar6 = lVar6 + 1;
        bVar12 = uVar11 != 0;
        uVar11 = uVar11 - 1;
      } while (bVar12);
      aVar7 = aVar7 & 0xf;
      uVar11 = 1;
      iVar2 = -4;
      do {
        aVar5 = aVar7 & RC_BIT_1;
        aVar7 = aVar7 >> 1;
        (coder->rc).symbols[sVar1 + lVar6] = aVar5;
        (coder->rc).probs[sVar1 + lVar6] = coder->pos_align + uVar11;
        uVar11 = aVar5 + uVar11 * 2;
        lVar6 = lVar6 + 1;
        iVar2 = iVar2 + 1;
      } while (iVar2 != 0);
      (coder->rc).count = sVar1 + lVar6;
      coder->align_price_count = coder->align_price_count + 1;
    }
  }
  coder->reps[3] = coder->reps[2];
  *(undefined8 *)(coder->reps + 1) = *(undefined8 *)coder->reps;
  coder->reps[0] = distance;
  coder->match_price_count = coder->match_price_count + 1;
  return;
}

Assistant:

static inline void
match(lzma_coder *coder, const uint32_t pos_state,
		const uint32_t distance, const uint32_t len)
{
	uint32_t pos_slot;
	uint32_t len_to_pos_state;

	update_match(coder->state);

	length(&coder->rc, &coder->match_len_encoder, pos_state, len,
			coder->fast_mode);

	pos_slot = get_pos_slot(distance);
	len_to_pos_state = get_len_to_pos_state(len);
	rc_bittree(&coder->rc, coder->pos_slot[len_to_pos_state],
			POS_SLOT_BITS, pos_slot);

	if (pos_slot >= START_POS_MODEL_INDEX) {
		const uint32_t footer_bits = (pos_slot >> 1) - 1;
		const uint32_t base = (2 | (pos_slot & 1)) << footer_bits;
		const uint32_t pos_reduced = distance - base;

		if (pos_slot < END_POS_MODEL_INDEX) {
			// Careful here: base - pos_slot - 1 can be -1, but
			// rc_bittree_reverse starts at probs[1], not probs[0].
			rc_bittree_reverse(&coder->rc,
				coder->pos_special + base - pos_slot - 1,
				footer_bits, pos_reduced);
		} else {
			rc_direct(&coder->rc, pos_reduced >> ALIGN_BITS,
					footer_bits - ALIGN_BITS);
			rc_bittree_reverse(
					&coder->rc, coder->pos_align,
					ALIGN_BITS, pos_reduced & ALIGN_MASK);
			++coder->align_price_count;
		}
	}

	coder->reps[3] = coder->reps[2];
	coder->reps[2] = coder->reps[1];
	coder->reps[1] = coder->reps[0];
	coder->reps[0] = distance;
	++coder->match_price_count;
}